

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredlines.cc
# Opt level: O2

void __thiscall gvr::ColoredLines::resizeLineList(ColoredLines *this,int ln)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < ln * 2) {
    uVar4 = (ulong)(uint)(ln * 2) * 4;
  }
  puVar3 = (uint *)operator_new__(uVar4);
  iVar2 = this->n;
  if (ln <= this->n) {
    iVar2 = ln;
  }
  puVar1 = this->line;
  for (uVar4 = (ulong)(uint)(iVar2 * 2); 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    puVar3[uVar4 - 1] = puVar1[uVar4 - 1];
  }
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  this->line = puVar3;
  this->n = ln;
  return;
}

Assistant:

void ColoredLines::resizeLineList(int ln)
{
  unsigned int *p=new unsigned int [(ln<<1)];

  for (int i=2*std::min(n, ln)-1; i>=0; i--)
  {
    p[i]=line[i];
  }

  delete [] line;

  line=p;
  n=ln;
}